

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file_read.c
# Opt level: O0

char * parse_name(char *line)

{
  char *delims;
  char *word;
  char *line_local;
  
  delims = strtok(line," \t\n");
  if ((*delims == '>') || (*delims == '@')) {
    delims = delims + 1;
  }
  return delims;
}

Assistant:

char *parse_name(char *line)
{
	char *word;
	char *delims = " \t\n"; /* space, tab, newline */
	word = strtok(line, delims);
	/* check if the name begins with '>' or '@' and drop it */
	if ( *word == '>' || *word == '@' )
		word++; /* move the word up one char */
	return word;
}